

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O2

int32_t ll_cloud_gpio_activate_pin(uint8_t pin)

{
  _Bool _Var1;
  uint uVar2;
  
  _Var1 = transport_mutex_grab();
  if (_Var1) {
    _ll_ifc_message_buff[0] = pin;
    uVar2 = hal_read_write(OP_GPIO_ENABLE_PIN,_ll_ifc_message_buff,1,(uint8_t *)0x0,0);
    transport_mutex_release();
    return (int)uVar2 >> 0x1f & uVar2;
  }
  return -0x71;
}

Assistant:

int32_t ll_cloud_gpio_activate_pin(uint8_t pin)
{
    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }
    _ll_ifc_message_buff[0] = pin;
    int32_t ret = hal_read_write(OP_GPIO_ENABLE_PIN, &_ll_ifc_message_buff[0], 1, NULL, 0);
    transport_mutex_release();

    return (ret >= 0) ? LL_IFC_ACK : ret;
}